

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O3

void __thiscall asmjit::X86RAPass::loadState(X86RAPass *this,RAState *src_)

{
  byte bVar1;
  ushort uVar2;
  void *pvVar3;
  VirtReg *pVVar4;
  long lVar5;
  ulong uVar6;
  RAState RVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong unaff_RBX;
  ulong unaff_RBP;
  X86RAState *src;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  
code_r0x0012483a:
  pvVar3 = (this->super_RAPass)._contextVd.super_ZoneVectorBase._data;
  uVar6 = (ulong)(uint)(this->super_RAPass)._contextVd.super_ZoneVectorBase._length;
  uVar12 = (this->_regCount).field_0._packed;
  uVar15 = (ulong)uVar12;
  if ((uVar12 & 0xff) != 0) {
    uVar12 = (uint)*(ushort *)(src_ + 0x148);
    uVar14 = 0;
    do {
      pVVar4 = *(VirtReg **)(src_ + uVar14 * 8);
      (this->_x86State).field_0._list[uVar14] = pVVar4;
      if (pVVar4 != (VirtReg *)0x0) {
        pVVar4->_state = '\x01';
        pVVar4->_physId = (uint8_t)uVar14;
        pVVar4->_modified = (byte)uVar12 & 1;
      }
      uVar14 = uVar14 + 1;
      uVar12 = uVar12 >> 1;
    } while ((uVar15 & 0xff) != uVar14);
    uVar15 = (ulong)(this->_regCount).field_0._packed;
  }
  uVar13 = (uint32_t)uVar15;
  if ((uVar15 & 0xff0000) != 0) {
    RVar7 = src_[0x14a];
    uVar14 = 0;
    do {
      lVar5 = *(long *)(src_ + uVar14 * 8 + 0x80);
      *(long *)((long)&(this->_x86State).field_0 + uVar14 * 8 + 0x80) = lVar5;
      if (lVar5 != 0) {
        *(undefined1 *)(lVar5 + 0x24) = 1;
        *(char *)(lVar5 + 0x25) = (char)uVar14;
        *(byte *)(lVar5 + 0x26) = (byte)RVar7 & 1;
      }
      uVar14 = uVar14 + 1;
      RVar7 = (RAState)((byte)RVar7 >> 1);
    } while (((uint)(uVar15 >> 0x10) & 0xff) != uVar14);
    uVar13 = (this->_regCount).field_0._packed;
  }
  uVar12 = uVar13 >> 8 & 0xff;
  if (uVar12 != 0) {
    uVar8 = *(uint *)(src_ + 0x14c);
    uVar15 = 0;
    do {
      lVar5 = *(long *)(src_ + uVar15 * 8 + 0xc0);
      *(long *)((long)&(this->_x86State).field_0 + uVar15 * 8 + 0xc0) = lVar5;
      if (lVar5 != 0) {
        *(undefined1 *)(lVar5 + 0x24) = 1;
        *(char *)(lVar5 + 0x25) = (char)uVar15;
        *(byte *)(lVar5 + 0x26) = (byte)uVar8 & 1;
      }
      uVar15 = uVar15 + 1;
      uVar8 = uVar8 >> 1;
    } while (uVar12 != uVar15);
  }
  (this->_x86State)._occupied.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x140);
  (this->_x86State)._modified.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x148);
  if (uVar6 != 0) {
    uVar15 = 0;
    do {
      if (((byte)src_[uVar15 + 0x150] & 3) != 1) {
        lVar5 = *(long *)((long)pvVar3 + uVar15 * 8);
        *(byte *)(lVar5 + 0x24) = (byte)src_[uVar15 + 0x150] & 3;
        *(undefined2 *)(lVar5 + 0x25) = 0xff;
      }
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
  *(ulong *)((long)register0x00000020 + -0x10) = unaff_RBX;
  *(void **)((long)register0x00000020 + -0x18) = pvVar3;
  uVar12 = (this->_regCount).field_0._packed;
  if ((uVar12 & 0xff) != 0) {
    uVar2 = (this->_x86State)._occupied.field_0.field_0._gp;
    src_ = (RAState *)(ulong)uVar2;
    uVar8 = 1;
    uVar6 = 0;
    do {
      pVVar4 = (this->_x86State).field_0._list[uVar6];
      uVar10 = (uint)(this->_x86State)._modified.field_0.field_0._gp;
      if (pVVar4 != (VirtReg *)0x0) {
        if ((uVar8 & uVar2) == 0) {
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247d6;
          _checkState();
LAB_001247d6:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247db;
          _checkState();
LAB_001247db:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247e0;
          _checkState();
LAB_001247e0:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247e5;
          _checkState();
        }
        else {
          uVar9 = (uint)(pVVar4->_modified != '\0') << ((byte)uVar6 & 0x1f);
          unaff_RBX = (ulong)uVar9;
          if ((uVar8 & uVar10) != uVar9) goto LAB_001247d6;
          if (((pVVar4->_regInfo)._signature & 0xf00) != 0) goto LAB_001247db;
          if (pVVar4->_state != '\x01') goto LAB_001247e0;
          if (uVar6 == pVVar4->_physId) goto LAB_00124688;
        }
        *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247ea;
        _checkState();
        goto LAB_001247ea;
      }
      if ((uVar8 & uVar2) != 0) goto LAB_0012481c;
      if ((uVar8 & uVar10) != 0) goto LAB_00124821;
LAB_00124688:
      uVar6 = uVar6 + 1;
      uVar8 = uVar8 * 2;
    } while (((ulong)uVar12 & 0xff) != uVar6);
  }
  if ((uVar12 >> 0x10 & 0xff) != 0) {
    bVar1 = (this->_x86State)._occupied.field_0.field_0._mm;
    src_ = (RAState *)(ulong)bVar1;
    uVar8 = 1;
    uVar6 = 0;
    do {
      lVar5 = *(long *)((long)&(this->_x86State).field_0 + uVar6 * 8 + 0x80);
      uVar10 = (uint)(this->_x86State)._modified.field_0.field_0._mm;
      if (lVar5 == 0) {
        if ((uVar8 & bVar1) != 0) goto LAB_00124826;
        if ((uVar8 & uVar10) != 0) goto LAB_0012482b;
      }
      else {
        if ((uVar8 & bVar1) == 0) goto LAB_001247ea;
        uVar10 = uVar8 & uVar10;
        unaff_RBX = (ulong)uVar10;
        uVar9 = (uint)(*(char *)(lVar5 + 0x26) != '\0') << ((byte)uVar6 & 0x1f);
        unaff_RBP = (ulong)uVar9;
        if (uVar10 != uVar9) goto LAB_001247ef;
        uVar10 = *(uint *)(lVar5 + 4) & 0xf00;
        unaff_RBX = (ulong)uVar10;
        if (uVar10 != 0x200) goto LAB_001247f4;
        if (*(char *)(lVar5 + 0x24) != '\x01') goto LAB_001247f9;
        if (uVar6 != *(byte *)(lVar5 + 0x25)) goto LAB_001247fe;
      }
      uVar6 = uVar6 + 1;
      uVar8 = uVar8 * 2;
    } while ((byte)(uVar12 >> 0x10) != uVar6);
  }
  uVar12 = uVar12 >> 8 & 0xff;
  if (uVar12 == 0) {
    return;
  }
  uVar8 = (this->_x86State)._occupied.field_0.field_0._vec;
  uVar10 = (this->_x86State)._modified.field_0.field_0._vec;
  src_ = (RAState *)(ulong)uVar10;
  uVar9 = 1;
  uVar6 = 0;
  do {
    lVar5 = *(long *)((long)&(this->_x86State).field_0 + uVar6 * 8 + 0xc0);
    if (lVar5 == 0) {
      if ((uVar9 & uVar8) != 0) goto LAB_00124830;
      if ((uVar9 & uVar10) != 0) goto LAB_00124835;
    }
    else {
      if ((uVar9 & uVar8) == 0) goto LAB_00124803;
      uVar11 = (uint)(*(char *)(lVar5 + 0x26) != '\0') << ((byte)uVar6 & 0x1f);
      unaff_RBX = (ulong)uVar11;
      if ((uVar9 & uVar10) != uVar11) goto LAB_00124808;
      if ((*(uint *)(lVar5 + 4) & 0xf00) != 0x100) goto LAB_0012480d;
      if (*(char *)(lVar5 + 0x24) != '\x01') goto LAB_00124812;
      if (uVar6 != *(byte *)(lVar5 + 0x25)) goto LAB_00124817;
    }
    uVar6 = uVar6 + 1;
    uVar9 = uVar9 * 2;
    if (uVar12 == uVar6) {
      return;
    }
  } while( true );
LAB_001247ea:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247ef;
  _checkState();
LAB_001247ef:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247f4;
  _checkState();
LAB_001247f4:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247f9;
  _checkState();
LAB_001247f9:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x1247fe;
  _checkState();
LAB_001247fe:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124803;
  _checkState();
LAB_00124803:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124808;
  _checkState();
LAB_00124808:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12480d;
  _checkState();
LAB_0012480d:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124812;
  _checkState();
LAB_00124812:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124817;
  _checkState();
LAB_00124817:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12481c;
  _checkState();
LAB_0012481c:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124821;
  _checkState();
LAB_00124821:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124826;
  _checkState();
LAB_00124826:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12482b;
  _checkState();
LAB_0012482b:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124830;
  _checkState();
LAB_00124830:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x124835;
  _checkState();
LAB_00124835:
  *(code **)((long)register0x00000020 + -0x20) = loadState;
  _checkState();
  register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x18);
  goto code_r0x0012483a;
}

Assistant:

ASMJIT_INLINE T* getData() noexcept { return static_cast<T*>(_data); }